

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O2

Var Js::JavascriptSymbol::EntryFor(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  charcount_t cVar6;
  undefined4 *puVar7;
  Var aValue;
  JavascriptString *this;
  char16 *pcVar8;
  PropertyRecord *propertyRecord;
  JavascriptSymbol *pJVar9;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x6a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00bca44f;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if ((local_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x6b,"(args.Info.Count)","Should always have implicit \'this\'.");
    if (!bVar5) goto LAB_00bca44f;
    *puVar7 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x6f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00bca44f;
    *puVar7 = 0;
  }
  if ((local_40._0_4_ & 0xfffffe) == 0) {
    this = StringCache::GetUndefinedDisplay(&pJVar2->stringCache);
  }
  else {
    aValue = Arguments::operator[]((Arguments *)local_40,1);
    this = JavascriptConversion::ToString(aValue,pSVar1);
  }
  pTVar3 = pSVar1->threadContext;
  pcVar8 = JavascriptString::GetString(this);
  cVar6 = JavascriptString::GetLength(this);
  propertyRecord = ThreadContext::GetSymbolFromRegistrationMap(pTVar3,pcVar8,cVar6);
  if (propertyRecord == (PropertyRecord *)0x0) {
    pTVar3 = pSVar1->threadContext;
    pcVar8 = JavascriptString::GetString(this);
    cVar6 = JavascriptString::GetLength(this);
    propertyRecord = ThreadContext::AddSymbolToRegistrationMap(pTVar3,pcVar8,cVar6);
    if (propertyRecord == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                  ,0x89,"(propertyRecord != nullptr)","propertyRecord != nullptr");
      if (!bVar5) {
LAB_00bca44f:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
      propertyRecord = (PropertyRecord *)0x0;
    }
  }
  pJVar9 = ScriptContext::GetSymbol(pSVar1,propertyRecord);
  return pJVar9;
}

Assistant:

Var JavascriptSymbol::EntryFor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count, "Should always have implicit 'this'.");
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString* key;

        if (args.Info.Count > 1)
        {
            key = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            key = library->GetUndefinedDisplayString();
        }

        // Search the global symbol registration map for a symbol with description equal to the string key.
        // The map can only have one symbol with that description so if we found a symbol, that is the registered
        // symbol for the string key.
        const Js::PropertyRecord* propertyRecord = scriptContext->GetThreadContext()->GetSymbolFromRegistrationMap(key->GetString(), key->GetLength());

        // If we didn't find a PropertyRecord in the map, we'll create a new symbol with description equal to the key string.
        // This is the only place we add new PropertyRecords to the map, so we should never have multiple PropertyRecords in the
        // map with the same string key value (since we would return the one we found above instead of creating a new one).
        if (propertyRecord == nullptr)
        {
            propertyRecord = scriptContext->GetThreadContext()->AddSymbolToRegistrationMap(key->GetString(), key->GetLength());
        }

        Assert(propertyRecord != nullptr);

        return scriptContext->GetSymbol(propertyRecord);
    }